

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

void __thiscall testing::internal::MatchMatrix::Randomize(MatchMatrix *this)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  byte *pbVar4;
  char *b;
  size_t irhs;
  size_t ilhs;
  MatchMatrix *this_local;
  
  irhs = 0;
  while( true ) {
    sVar2 = LhsSize(this);
    if (sVar2 <= irhs) break;
    b = (char *)0x0;
    while( true ) {
      pcVar3 = (char *)RhsSize(this);
      if (pcVar3 <= b) break;
      sVar2 = SpaceIndex(this,irhs,(size_t)b);
      pbVar4 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&this->matched_,sVar2);
      iVar1 = rand();
      *pbVar4 = (byte)iVar1 & 1;
      b = b + 1;
    }
    irhs = irhs + 1;
  }
  return;
}

Assistant:

void MatchMatrix::Randomize() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      b = static_cast<char>(rand() & 1);  // NOLINT
    }
  }
}